

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *this,uint8_t i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *attributes)

{
  initializer_list<unsigned_char> __l;
  size_type sVar1;
  mexcept *this_00;
  allocator<char> local_79;
  string local_78;
  allocator<unsigned_char> local_42;
  uint8_t local_41;
  iterator local_40;
  size_type local_38;
  undefined1 local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *attributes_local;
  assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *paStack_18;
  uint8_t i_local;
  assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  
  local_29 = 0;
  local_40 = &local_41;
  local_38 = 1;
  local_41 = i;
  local_28 = attributes;
  attributes_local._7_1_ = i;
  paStack_18 = this;
  this_local = (assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *)
               __return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_42);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__l,&local_42);
  std::allocator<unsigned_char>::~allocator(&local_42);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_28);
  if (sVar1 == 1) {
    assemble_operands<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>,0ul>
              (this,__return_storage_ptr__,local_28);
    return __return_storage_ptr__;
  }
  this_00 = (mexcept *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"[-][mvm] invalid instruction operands",&local_79);
  mexcept::mexcept(this_00,&local_78,BAD_INSTR_OPERAND);
  __cxa_throw(this_00,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

std::vector<uint8_t> assembler<Set, MetaCodeImpl>::assemble_instr(
    uint8_t i, std::vector<std::string> const &attributes) const {
  std::vector<uint8_t> bytes = {i};

  if constexpr (concept ::is_code_consumer<I>()) {
    using cc_type = typename I::bytecode_type;

    if (attributes.size() != list::size_v<cc_type>) {
      throw mexcept("[-][mvm] invalid instruction operands",
                    status_type::BAD_INSTR_OPERAND);
    }

    assemble_operands<I>(bytes, attributes,
                         std::make_index_sequence<list::size_v<cc_type>>());
  } else {
    if (attributes.size() != 0) {
      throw mexcept("[-][mvm] invalid instruction operands",
                    status_type::BAD_INSTR_OPERAND);
    }
  }

  return bytes;
}